

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# egluConfigInfo.cpp
# Opt level: O3

void eglu::queryCoreConfigInfo(Library *egl,EGLDisplay display,EGLConfig config,ConfigInfo *dst)

{
  deUint32 err;
  
  (*egl->_vptr_Library[0x19])();
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3024,dst + 4);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3023,dst + 8);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3022,dst + 0xc);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303d,dst + 0x10);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3021,dst + 0x14);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303e,dst + 0x18);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3039,dst + 0x1c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303a,dst + 0x20);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303f,dst + 0x24);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3027,dst + 0x28);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3028,dst + 0x2c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3042,dst + 0x30);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3025,dst + 0x34);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3029,dst + 0x38);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302c,dst + 0x3c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302a,dst + 0x40);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303c,dst + 0x44);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x303b,dst + 0x48);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302d,dst + 0x4c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302e,dst + 0x50);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x302f,dst + 0x54);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3040,dst + 0x58);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3032,dst + 0x5c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3031,dst + 0x60);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3026,dst + 100);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3033,dst + 0x68);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3034,dst + 0x6c);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3037,dst + 0x70);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3036,dst + 0x74);
  (*egl->_vptr_Library[0x19])(egl,display,config,0x3035,dst + 0x78);
  err = (*egl->_vptr_Library[0x1f])(egl);
  checkError(err,"Failed to query config info",
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/egl/egluConfigInfo.cpp"
             ,0x78);
  return;
}

Assistant:

void queryCoreConfigInfo (const Library& egl, EGLDisplay display, EGLConfig config, ConfigInfo* dst)
{
	egl.getConfigAttrib(display, config, EGL_BUFFER_SIZE,				&dst->bufferSize);
	egl.getConfigAttrib(display, config, EGL_RED_SIZE,					&dst->redSize);
	egl.getConfigAttrib(display, config, EGL_GREEN_SIZE,				&dst->greenSize);
	egl.getConfigAttrib(display, config, EGL_BLUE_SIZE,					&dst->blueSize);
	egl.getConfigAttrib(display, config, EGL_LUMINANCE_SIZE,			&dst->luminanceSize);
	egl.getConfigAttrib(display, config, EGL_ALPHA_SIZE,				&dst->alphaSize);
	egl.getConfigAttrib(display, config, EGL_ALPHA_MASK_SIZE,			&dst->alphaMaskSize);
	egl.getConfigAttrib(display, config, EGL_BIND_TO_TEXTURE_RGB,		(EGLint*)&dst->bindToTextureRGB);
	egl.getConfigAttrib(display, config, EGL_BIND_TO_TEXTURE_RGBA,		(EGLint*)&dst->bindToTextureRGBA);
	egl.getConfigAttrib(display, config, EGL_COLOR_BUFFER_TYPE,			(EGLint*)&dst->colorBufferType);
	egl.getConfigAttrib(display, config, EGL_CONFIG_CAVEAT,				(EGLint*)&dst->configCaveat);
	egl.getConfigAttrib(display, config, EGL_CONFIG_ID,					&dst->configId);
	egl.getConfigAttrib(display, config, EGL_CONFORMANT,				&dst->conformant);
	egl.getConfigAttrib(display, config, EGL_DEPTH_SIZE,				&dst->depthSize);
	egl.getConfigAttrib(display, config, EGL_LEVEL,						&dst->level);
	egl.getConfigAttrib(display, config, EGL_MAX_PBUFFER_WIDTH,			&dst->maxPbufferWidth);
	egl.getConfigAttrib(display, config, EGL_MAX_PBUFFER_HEIGHT,		&dst->maxPbufferHeight);
	egl.getConfigAttrib(display, config, EGL_MAX_SWAP_INTERVAL,			&dst->maxSwapInterval);
	egl.getConfigAttrib(display, config, EGL_MIN_SWAP_INTERVAL,			&dst->minSwapInterval);
	egl.getConfigAttrib(display, config, EGL_NATIVE_RENDERABLE,			(EGLint*)&dst->nativeRenderable);
	egl.getConfigAttrib(display, config, EGL_NATIVE_VISUAL_ID,			&dst->nativeVisualId);
	egl.getConfigAttrib(display, config, EGL_NATIVE_VISUAL_TYPE,		&dst->nativeVisualType);
	egl.getConfigAttrib(display, config, EGL_RENDERABLE_TYPE,			&dst->renderableType);
	egl.getConfigAttrib(display, config, EGL_SAMPLE_BUFFERS,			&dst->sampleBuffers);
	egl.getConfigAttrib(display, config, EGL_SAMPLES,					&dst->samples);
	egl.getConfigAttrib(display, config, EGL_STENCIL_SIZE,				&dst->stencilSize);
	egl.getConfigAttrib(display, config, EGL_SURFACE_TYPE,				&dst->surfaceType);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_TYPE,			(EGLint*)&dst->transparentType);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_RED_VALUE,		&dst->transparentRedValue);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_GREEN_VALUE,	&dst->transparentGreenValue);
	egl.getConfigAttrib(display, config, EGL_TRANSPARENT_BLUE_VALUE,	&dst->transparentBlueValue);
	EGLU_CHECK_MSG(egl, "Failed to query config info");
}